

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

AssertionExpr *
slang::ast::ConditionalAssertionExpr::fromSyntax
          (ConditionalPropertyExprSyntax *syntax,ASTContext *context)

{
  int iVar1;
  Expression *this;
  PropertyExprSyntax *pPVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ConditionalAssertionExpr *pCVar3;
  sockaddr *in_RSI;
  long in_RDI;
  AssertionExpr *elseExpr;
  AssertionExpr *ifExpr;
  Expression *cond;
  Compilation *comp;
  AssertionExpr **in_stack_ffffffffffffffc8;
  AssertionExpr *args_1;
  Expression *args;
  
  ASTContext::getCompilation((ASTContext *)0xb41f78);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xb41f8b);
  this = bindExpr((ExpressionSyntax *)context,(ASTContext *)comp,cond._7_1_,cond._6_1_);
  pPVar2 = not_null<slang::syntax::PropertyExprSyntax_*>::operator*
                     ((not_null<slang::syntax::PropertyExprSyntax_*> *)0xb41fb2);
  iVar1 = AssertionExpr::bind((int)pPVar2,in_RSI,0);
  args = (Expression *)CONCAT44(extraout_var,iVar1);
  args_1 = (AssertionExpr *)0x0;
  if (*(long *)(in_RDI + 0x58) != 0) {
    pPVar2 = not_null<slang::syntax::PropertyExprSyntax_*>::operator*
                       ((not_null<slang::syntax::PropertyExprSyntax_*> *)0xb41fef);
    iVar1 = AssertionExpr::bind((int)pPVar2,in_RSI,0);
    args_1 = (AssertionExpr *)CONCAT44(extraout_var_00,iVar1);
  }
  pCVar3 = BumpAllocator::
           emplace<slang::ast::ConditionalAssertionExpr,slang::ast::Expression_const&,slang::ast::AssertionExpr_const&,slang::ast::AssertionExpr_const*&>
                     ((BumpAllocator *)this,args,args_1,in_stack_ffffffffffffffc8);
  return &pCVar3->super_AssertionExpr;
}

Assistant:

AssertionExpr& ConditionalAssertionExpr::fromSyntax(const ConditionalPropertyExprSyntax& syntax,
                                                    const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& cond = bindExpr(*syntax.condition, context);
    auto& ifExpr = bind(*syntax.expr, context);

    const AssertionExpr* elseExpr = nullptr;
    if (syntax.elseClause)
        elseExpr = &bind(*syntax.elseClause->expr, context);

    return *comp.emplace<ConditionalAssertionExpr>(cond, ifExpr, elseExpr);
}